

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O2

char * same_path(char *pixname,char *hdrname)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  
  pcVar4 = (char *)calloc(0x1ff,1);
  if (pcVar4 == (char *)0x0) {
    ffpmsg("iraffits same_path: Cannot alloc memory for newpixname");
    return (char *)0x0;
  }
  iVar1 = strncmp(pixname,"HDR$",4);
  if (iVar1 == 0) {
    strncpy(pcVar4,hdrname,0xff);
    uVar8 = strlen(pcVar4);
    uVar2 = (uint)uVar8;
    while ((uVar3 = (uint)uVar8, uVar9 = (int)uVar2 >> 0x1f & uVar2, 0 < (int)uVar3 &&
           (uVar9 = uVar3, pcVar4[(uVar8 & 0xffffffff) - 1] != '/'))) {
      uVar8 = (ulong)(uVar3 - 1);
    }
    pcVar4[(int)uVar9] = '\0';
    pixname = pixname + 4;
  }
  else {
    pcVar5 = strchr(pixname,0x2f);
    if ((pcVar5 != (char *)0x0) || (pcVar5 = strchr(pixname,0x24), pcVar5 != (char *)0x0)) {
      if (*pixname != 'H') {
        return pcVar4;
      }
      if (pixname[1] != 'D') {
        return pcVar4;
      }
      if (pixname[2] != 'R') {
        return pcVar4;
      }
      strncpy(pcVar4,hdrname,0xff);
      sVar6 = strlen(pcVar4);
      lVar7 = sVar6 << 0x20;
      pcVar4[lVar7 + -0x300000000 >> 0x20] = 'p';
      pcVar4[lVar7 + -0x200000000 >> 0x20] = 'i';
      pcVar4[lVar7 + -0x100000000 >> 0x20] = 'x';
      return pcVar4;
    }
    strncpy(pcVar4,hdrname,0xff);
    uVar8 = strlen(pcVar4);
    uVar2 = (uint)uVar8;
    while ((uVar3 = (uint)uVar8, uVar9 = (int)uVar2 >> 0x1f & uVar2, 0 < (int)uVar3 &&
           (uVar9 = uVar3, pcVar4[(uVar8 & 0xffffffff) - 1] != '/'))) {
      uVar8 = (ulong)(uVar3 - 1);
    }
    pcVar4[(int)uVar9] = '\0';
  }
  pcVar4 = strncat(pcVar4,pixname,0xff);
  return pcVar4;
}

Assistant:

static char *same_path (

char	*pixname,	/* IRAF pixel file pathname */
const char	*hdrname)	/* IRAF image header file pathname */

{
    int len;
    char *newpixname;

/*  WDP - 10/16/2007 - increased allocation to avoid possible overflow */
/*    newpixname = (char *) calloc (SZ_IM2PIXFILE, sizeof (char)); */

    newpixname = (char *) calloc (2*SZ_IM2PIXFILE+1, sizeof (char));
    if (newpixname == NULL) {
            ffpmsg("iraffits same_path: Cannot alloc memory for newpixname");
	    return (NULL);
	}

    /* Pixel file is in same directory as header */
    if (strncmp(pixname, "HDR$", 4) == 0 ) {
	(void)strncpy (newpixname, hdrname, SZ_IM2PIXFILE);

	/* find the end of the pathname */
	len = strlen (newpixname);
#ifndef VMS
	while( (len > 0) && (newpixname[len-1] != '/') )
#else
	while( (len > 0) && (newpixname[len-1] != ']') && (newpixname[len-1] != ':') )
#endif
	    len--;

	/* add name */
	newpixname[len] = '\0';
	(void)strncat (newpixname, &pixname[4], SZ_IM2PIXFILE);
	}

    /* Bare pixel file with no path is assumed to be same as HDR$filename */
    else if (strchr (pixname, '/') == NULL && strchr (pixname, '$') == NULL) {
	(void)strncpy (newpixname, hdrname, SZ_IM2PIXFILE);

	/* find the end of the pathname */
	len = strlen (newpixname);
#ifndef VMS
	while( (len > 0) && (newpixname[len-1] != '/') )
#else
	while( (len > 0) && (newpixname[len-1] != ']') && (newpixname[len-1] != ':') )
#endif
	    len--;

	/* add name */
	newpixname[len] = '\0';
	(void)strncat (newpixname, pixname, SZ_IM2PIXFILE);
	}

    /* Pixel file has same name as header file, but with .pix extension */
    else if (strncmp (pixname, "HDR", 3) == 0) {

	/* load entire header name string into name buffer */
	(void)strncpy (newpixname, hdrname, SZ_IM2PIXFILE);
	len = strlen (newpixname);
	newpixname[len-3] = 'p';
	newpixname[len-2] = 'i';
	newpixname[len-1] = 'x';
	}

    return (newpixname);
}